

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O0

bool __thiscall LexicalAnalyzer::isCorrectVariable(LexicalAnalyzer *this,string *str)

{
  char *pcVar1;
  string local_78 [48];
  string local_48 [36];
  int local_24;
  string *psStack_20;
  int ch;
  string *str_local;
  LexicalAnalyzer *this_local;
  
  psStack_20 = str;
  str_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
  local_24 = (int)*pcVar1;
  if ((((local_24 < 0x41) || (0x5a < local_24)) && ((local_24 < 0x61 || (0x7a < local_24)))) &&
     ((((local_24 < 0x30 || (0x39 < local_24)) && (local_24 != 0x23)) &&
      ((local_24 != 0x5f && (local_24 != 0x24)))))) {
    this_local._7_1_ = false;
  }
  else if (((local_24 == 0x23) || (local_24 == 0x24)) || ((0x2f < local_24 && (local_24 < 0x3a)))) {
    std::__cxx11::string::operator=
              ((string *)&this->m_pairErrors,"Invalid syntax. It doesn\'t match to C++ variable");
    std::__cxx11::string::string(local_48,(string *)str);
    endVariable(this,(string *)local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::operator=
              ((string *)&(this->m_pairErrors).second,(string *)&this->variable);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->m_vecErrors,&this->m_pairErrors);
    std::__cxx11::string::operator=((string *)&this->variable,"");
    this->m_token = VARIABLE;
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string(local_78,(string *)str);
    endVariable(this,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_DefinedVariables,&this->variable);
    std::__cxx11::string::operator=((string *)&this->variable,"");
    this->m_token = VARIABLE;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LexicalAnalyzer::isCorrectVariable(string str) {
    int ch = str[index];
    if (((ch >= 65) && (ch <= 90)) || ((ch >= 97) && (ch <= 122)) || ((ch >= 48) && (ch <= 57)) || (ch == '#') ||
        (ch == '_') || (ch == '$')) {
        if (((ch == '#') || (ch == '$')) || ((ch >= 48) && (ch <= 57))) {

            m_pairErrors.first = "Invalid syntax. It doesn't match to C++ variable";
            endVariable(str);
            m_pairErrors.second = variable;
            m_vecErrors.push_back(m_pairErrors);
            variable="";
            m_token = VARIABLE;
            return false;
        }
        else{
            endVariable(str);
            m_DefinedVariables.push_back(variable);
            variable ="";
            m_token = VARIABLE;
            return true;
        }
    }
    return false;
}